

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_bool mz_zip_reader_extract_to_mem_no_alloc
                  (mz_zip_archive *pZip,mz_uint file_index,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  mz_bool mVar1;
  tinfl_status tVar2;
  size_t sVar3;
  size_t sVar4;
  mz_ulong mVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  mz_uint64 mVar9;
  long lVar10;
  ulong local_2dc0;
  mz_uint64 local_2db8;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  
  if ((pBuf != (void *)0x0 || buf_size == 0) &&
     (mVar1 = mz_zip_reader_file_stat(pZip,file_index,&file_stat), mVar9 = file_stat.m_comp_size,
     mVar1 != 0)) {
    if (file_stat.m_comp_size == 0) {
      return 1;
    }
    mVar1 = mz_zip_reader_is_file_a_directory(pZip,file_index);
    if (mVar1 != 0) {
      return 1;
    }
    if ((((byte)file_stat.m_bit_flag & 0x21) == 0) &&
       (((flags >> 10 & 1) != 0 || ((file_stat.m_method & 0xfff7) == 0)))) {
      if ((flags >> 10 & 1) == 0) {
        mVar9 = file_stat.m_uncomp_size;
      }
      if (((mVar9 <= buf_size) &&
          (sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_local_header_ofs,local_header_u32
                                    ,0x1e), sVar3 == 0x1e)) && (local_header_u32[0] == 0x4034b50)) {
        if (file_stat.m_local_header_ofs + local_header_u32[6]._2_2_ +
            (ulong)(ushort)local_header_u32[7] + file_stat.m_comp_size + 0x1e <=
            pZip->m_archive_size) {
          local_2db8 = (ulong)(ushort)local_header_u32[7] +
                       file_stat.m_local_header_ofs + local_header_u32[6]._2_2_ + 0x1e;
          if (((flags >> 10 & 1) != 0) || (file_stat.m_method == 0)) {
            sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2db8,pBuf,mVar9);
            if ((flags >> 10 & 1) != 0) {
              return (uint)(sVar3 == mVar9);
            }
            if (sVar3 != mVar9) {
              return (uint)(sVar3 == mVar9);
            }
            mVar5 = mz_crc32(0,(mz_uint8 *)pBuf,file_stat.m_uncomp_size);
            return (uint)(mVar5 == file_stat.m_crc32);
          }
          inflator.m_state = 0;
          pvVar6 = pZip->m_pState->m_pMem;
          if (pvVar6 == (void *)0x0) {
            if (pUser_read_buf == (void *)0x0) {
              local_2dc0 = file_stat.m_comp_size;
              if (0xffff < file_stat.m_comp_size) {
                local_2dc0 = 0x10000;
              }
              pvVar6 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2dc0);
              if (pvVar6 == (void *)0x0) {
                return 0;
              }
              uVar8 = 0;
              uVar7 = file_stat.m_comp_size;
            }
            else {
              local_2dc0 = user_read_buf_size;
              uVar8 = 0;
              uVar7 = file_stat.m_comp_size;
              pvVar6 = pUser_read_buf;
              if (user_read_buf_size == 0) {
                return 0;
              }
            }
          }
          else {
            local_2dc0 = file_stat.m_comp_size;
            uVar7 = 0;
            uVar8 = file_stat.m_comp_size;
            pvVar6 = (void *)((long)pvVar6 + local_2db8);
          }
          sVar3 = 0;
          lVar10 = 0;
          do {
            out_buf_size = file_stat.m_uncomp_size - sVar3;
            if (uVar8 == 0) {
              if (pZip->m_pState->m_pMem == (void *)0x0) {
                uVar8 = uVar7;
                if (local_2dc0 < uVar7) {
                  uVar8 = local_2dc0;
                }
                sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2db8,pvVar6,uVar8);
                if (sVar4 != uVar8) goto LAB_001756f8;
                local_2db8 = local_2db8 + uVar8;
                uVar7 = uVar7 - uVar8;
                lVar10 = 0;
              }
              else {
                uVar8 = 0;
              }
            }
            in_buf_size = uVar8;
            tVar2 = tinfl_decompress(&inflator,(mz_uint8 *)(lVar10 + (long)pvVar6),&in_buf_size,
                                     (mz_uint8 *)pBuf,(mz_uint8 *)((long)pBuf + sVar3),&out_buf_size
                                     ,(uVar7 != 0) + 4 + (uint)(uVar7 != 0));
            uVar8 = uVar8 - in_buf_size;
            lVar10 = lVar10 + in_buf_size;
            sVar3 = sVar3 + out_buf_size;
          } while (tVar2 == TINFL_STATUS_NEEDS_MORE_INPUT);
          if (((tVar2 == TINFL_STATUS_DONE) && (sVar3 == file_stat.m_uncomp_size)) &&
             (mVar5 = mz_crc32(0,(mz_uint8 *)pBuf,sVar3), mVar5 == file_stat.m_crc32)) {
            mVar1 = 1;
          }
          else {
LAB_001756f8:
            mVar1 = 0;
          }
          if (pUser_read_buf != (void *)0x0 || pZip->m_pState->m_pMem != (void *)0x0) {
            return mVar1;
          }
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pvVar6);
          return mVar1;
        }
      }
    }
  }
  return 0;
}

Assistant:

mz_bool mz_zip_reader_extract_to_mem_no_alloc(mz_zip_archive *pZip,
                                              mz_uint file_index, void *pBuf,
                                              size_t buf_size, mz_uint flags,
                                              void *pUser_read_buf,
                                              size_t user_read_buf_size) {
  int status = TINFL_STATUS_DONE;
  mz_uint64 needed_size, cur_file_ofs, comp_remaining,
      out_buf_ofs = 0, read_buf_size, read_buf_ofs = 0, read_buf_avail;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  tinfl_decompressor inflator;

  if ((buf_size) && (!pBuf))
    return MZ_FALSE;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  // Empty file, or a directory (but not always a directory - I've seen odd zips
  // with directories that have compressed data which inflates to 0 bytes)
  if (!file_stat.m_comp_size)
    return MZ_TRUE;

  // Entry is a subdirectory (I've seen old zips with dir entries which have
  // compressed deflate data which inflates to 0 bytes, but these entries claim
  // to uncompress to 512 bytes in the headers).
  // I'm torn how to handle this case - should it fail instead?
  if (mz_zip_reader_is_file_a_directory(pZip, file_index))
    return MZ_TRUE;

  // Encryption and patch files are not supported.
  if (file_stat.m_bit_flag & (1 | 32))
    return MZ_FALSE;

  // This function only supports stored and deflate.
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return MZ_FALSE;

  // Ensure supplied output buffer is large enough.
  needed_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size
                                                      : file_stat.m_uncomp_size;
  if (buf_size < needed_size)
    return MZ_FALSE;

  // Read and parse the local directory entry.
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;

  cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return MZ_FALSE;

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    // The file is stored or the caller has requested the compressed data.
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                      (size_t)needed_size) != needed_size)
      return MZ_FALSE;
    return ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) != 0) ||
           (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                     (size_t)file_stat.m_uncomp_size) == file_stat.m_crc32);
  }

  // Decompress the file either directly from memory or from a file input
  // buffer.
  tinfl_init(&inflator);

  if (pZip->m_pState->m_pMem) {
    // Read directly from the archive in memory.
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else if (pUser_read_buf) {
    // Use a user provided read buffer.
    if (!user_read_buf_size)
      return MZ_FALSE;
    pRead_buf = (mz_uint8 *)pUser_read_buf;
    read_buf_size = user_read_buf_size;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  } else {
    // Temporarily allocate a read buffer.
    read_buf_size = MZ_MIN(file_stat.m_comp_size, MZ_ZIP_MAX_IO_BUF_SIZE);
#ifdef _MSC_VER
    if (((0, sizeof(size_t) == sizeof(mz_uint32))) &&
        (read_buf_size > 0x7FFFFFFF))
#else
    if (((sizeof(size_t) == sizeof(mz_uint32))) && (read_buf_size > 0x7FFFFFFF))
#endif
      return MZ_FALSE;
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return MZ_FALSE;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  do {
    size_t in_buf_size,
        out_buf_size = (size_t)(file_stat.m_uncomp_size - out_buf_ofs);
    if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
      read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
      if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                        (size_t)read_buf_avail) != read_buf_avail) {
        status = TINFL_STATUS_FAILED;
        break;
      }
      cur_file_ofs += read_buf_avail;
      comp_remaining -= read_buf_avail;
      read_buf_ofs = 0;
    }
    in_buf_size = (size_t)read_buf_avail;
    status = tinfl_decompress(
        &inflator, (mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
        (mz_uint8 *)pBuf, (mz_uint8 *)pBuf + out_buf_ofs, &out_buf_size,
        TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF |
            (comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0));
    read_buf_avail -= in_buf_size;
    read_buf_ofs += in_buf_size;
    out_buf_ofs += out_buf_size;
  } while (status == TINFL_STATUS_NEEDS_MORE_INPUT);

  if (status == TINFL_STATUS_DONE) {
    // Make sure the entire file was decompressed, and check its CRC.
    if ((out_buf_ofs != file_stat.m_uncomp_size) ||
        (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                  (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32))
      status = TINFL_STATUS_FAILED;
  }

  if ((!pZip->m_pState->m_pMem) && (!pUser_read_buf))
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

  return status == TINFL_STATUS_DONE;
}